

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_rendering_attachment_location_info
          (Impl *this,Value *state,VkRenderingAttachmentLocationInfoKHR **out_info)

{
  Number in_RAX;
  VkRenderingAttachmentLocationInfoKHR *pVVar1;
  Type pGVar2;
  Number NVar3;
  uint32_t *__s;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar4;
  size_t size;
  ulong uVar5;
  undefined8 local_38;
  
  local_38 = in_RAX;
  pVVar1 = (VkRenderingAttachmentLocationInfoKHR *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar1 != (VkRenderingAttachmentLocationInfoKHR *)0x0) {
    *(undefined8 *)&pVVar1->colorAttachmentCount = 0;
    pVVar1->pColorAttachmentLocations = (uint32_t *)0x0;
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
  }
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"colorAttachmentCount");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) ==
      (undefined1  [16])0x0) {
LAB_00127dea:
    __assert_fail("data_.f.flags & kUintFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x719,
                  "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  pVVar1->colorAttachmentCount = (pGVar2->data_).s.length;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffc8,(Ch *)state);
  NVar3.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(state);
  if (local_38 != NVar3.i64) {
    if ((ulong)pVVar1->colorAttachmentCount == 0) {
      __s = (uint32_t *)0x0;
    }
    else {
      size = (ulong)pVVar1->colorAttachmentCount << 2;
      __s = (uint32_t *)ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
      if (__s != (uint32_t *)0x0) {
        memset(__s,0,size);
      }
      if (pVVar1->colorAttachmentCount != 0) {
        uVar5 = 0;
        do {
          pGVar2 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)state,"colorAttachmentLocations");
          pGVar4 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator[](pGVar2,(SizeType)uVar5);
          if ((undefined1  [16])
              ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) ==
              (undefined1  [16])0x0) goto LAB_00127dea;
          __s[uVar5] = (pGVar4->data_).s.length;
          uVar5 = uVar5 + 1;
        } while (uVar5 < pVVar1->colorAttachmentCount);
      }
    }
    pVVar1->pColorAttachmentLocations = __s;
  }
  *out_info = pVVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_rendering_attachment_location_info(const Value &state, VkRenderingAttachmentLocationInfoKHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkRenderingAttachmentLocationInfoKHR>();
	info->colorAttachmentCount = state["colorAttachmentCount"].GetUint();
	if (state.HasMember("colorAttachmentLocations"))
	{
		auto *locs = allocator.allocate_n_cleared<uint32_t>(info->colorAttachmentCount);
		for (uint32_t i = 0; i < info->colorAttachmentCount; i++)
			locs[i] = state["colorAttachmentLocations"][i].GetUint();
		info->pColorAttachmentLocations = locs;
	}

	*out_info = info;
	return true;
}